

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_elements_pegin_contract_script_from_bytes
              (uchar *redeem_script,size_t redeem_script_len,uchar *script,size_t script_len,
              uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  int iVar1;
  size_t local_1f0;
  size_t push_size;
  secp256k1_pubkey pub_key_combined;
  secp256k1_pubkey *pub_key_combination [2];
  secp256k1_pubkey pub_key_tweaked;
  secp256k1_pubkey pub_key_from_tweak;
  secp256k1_pubkey pub_key;
  uchar tweak [32];
  size_t local_b0;
  size_t opcode_size;
  size_t offset_siz;
  size_t size_out;
  int ret;
  _Bool op_else_found;
  size_t ser_len;
  size_t bytes_len;
  uchar *q;
  uchar *p;
  secp256k1_context *ctx;
  uchar ser_pub_key [33];
  uchar *bytes_out_local;
  uint32_t flags_local;
  size_t script_len_local;
  uchar *script_local;
  size_t redeem_script_len_local;
  uchar *redeem_script_local;
  
  unique0x100003c0 = bytes_out;
  p = (uchar *)secp_ctx();
  bytes_len = (size_t)stack0xffffffffffffffc0;
  _ret = 0x21;
  size_out._7_1_ = 0;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (((((redeem_script == (uchar *)0x0) || (redeem_script_len == 0)) || (script == (uchar *)0x0))
      || ((script_len == 0 || (flags != 0)))) ||
     ((stack0xffffffffffffffc0 == (uchar *)0x0 ||
      (ser_len = redeem_script_len, q = redeem_script, len != redeem_script_len)))) {
    redeem_script_local._4_4_ = -2;
  }
  else {
    do {
      size_out._0_4_ = script_get_push_size_from_bytes(q,ser_len,&offset_siz);
      if ((int)size_out == 0) {
        size_out._0_4_ = script_get_push_opcode_size_from_bytes(q,ser_len,&local_b0);
        if ((int)size_out != 0) {
          return (int)size_out;
        }
        opcode_size = offset_siz + local_b0;
        if (ser_len < opcode_size) {
          return -2;
        }
        if (((local_b0 == 1) && (offset_siz == 0x21)) && ((size_out._7_1_ & 1) == 0)) {
          iVar1 = pubkey_parse((secp256k1_pubkey *)(pub_key_from_tweak.data + 0x38),q + 1,0x21);
          if (iVar1 == 0) {
            return -1;
          }
          memcpy(pub_key_combination + 1,pub_key_from_tweak.data + 0x38,0x40);
          size_out._0_4_ = wally_hmac_sha256(q + 1,0x21,script,script_len,pub_key.data + 0x38,0x20);
          if ((int)size_out != 0) {
            return (int)size_out;
          }
          iVar1 = secp256k1_ec_pubkey_tweak_add
                            ((secp256k1_context *)p,(secp256k1_pubkey *)(pub_key_combination + 1),
                             pub_key.data + 0x38);
          if (iVar1 == 0) {
            return -1;
          }
          iVar1 = pubkey_serialize((uchar *)&ctx,(size_t *)&ret,
                                   (secp256k1_pubkey *)(pub_key_combination + 1),0x102);
          if (iVar1 == 0) {
            return -1;
          }
          size_out._0_4_ =
               wally_script_push_from_bytes
                         ((uchar *)&ctx,_ret,0,(uchar *)bytes_len,ser_len,&local_1f0);
          if ((int)size_out != 0) {
            return (int)size_out;
          }
          iVar1 = secp256k1_ec_pubkey_create
                            ((secp256k1_context *)p,
                             (secp256k1_pubkey *)(pub_key_tweaked.data + 0x38),pub_key.data + 0x38);
          if (iVar1 == 0) {
            return -1;
          }
          iVar1 = pubkey_negate((secp256k1_pubkey *)(pub_key_from_tweak.data + 0x38));
          if (iVar1 == 0) {
            return -1;
          }
          pub_key_combined.data._56_8_ = pub_key_from_tweak.data + 0x38;
          pub_key_combination[0] = (secp256k1_pubkey *)(pub_key_combination + 1);
          iVar1 = pubkey_combine((secp256k1_pubkey *)&push_size,
                                 (secp256k1_pubkey **)(pub_key_combined.data + 0x38),2);
          if (iVar1 == 0) {
            return -1;
          }
          iVar1 = memcmp(&push_size,pub_key_tweaked.data + 0x38,0x40);
          if (iVar1 != 0) {
            return -1;
          }
        }
        else {
          memcpy((void *)bytes_len,q,opcode_size);
        }
        ser_len = ser_len - opcode_size;
        bytes_len = opcode_size + bytes_len;
        q = q + opcode_size;
      }
      else {
        if (*q == 'g') {
          size_out._7_1_ = 1;
        }
        *(uchar *)bytes_len = *q;
        ser_len = ser_len - 1;
        bytes_len = bytes_len + 1;
        q = q + 1;
      }
    } while (ser_len != 0);
    if (written != (size_t *)0x0) {
      *written = redeem_script_len;
    }
    redeem_script_local._4_4_ = 0;
  }
  return redeem_script_local._4_4_;
}

Assistant:

int wally_elements_pegin_contract_script_from_bytes(const unsigned char *redeem_script,
                                                    size_t redeem_script_len,
                                                    const unsigned char *script,
                                                    size_t script_len,
                                                    uint32_t flags,
                                                    unsigned char *bytes_out,
                                                    size_t len,
                                                    size_t *written)
{
    unsigned char ser_pub_key[EC_PUBLIC_KEY_LEN];
    const secp256k1_context *ctx = secp_ctx();
    const unsigned char *p = redeem_script;
    unsigned char *q = bytes_out;
    size_t bytes_len = redeem_script_len;
    size_t ser_len = EC_PUBLIC_KEY_LEN;
    /* For liquidv1 initial watchman template, don't tweak emergency keys. in the future, use flags to change watchmen template */
    bool op_else_found = false;

    int ret;

    if (written)
        *written = 0;

    if (!redeem_script || !redeem_script_len || !script ||
        !script_len || flags || !bytes_out || len != redeem_script_len)
        return WALLY_EINVAL;

    for (;;) {
        size_t size_out;
        ret = script_get_push_size_from_bytes(p, bytes_len, &size_out);
        if (ret == WALLY_OK) {
            size_t offset_siz;
            size_t opcode_size;

            if ((ret = script_get_push_opcode_size_from_bytes(p, bytes_len, &opcode_size)) != WALLY_OK)
                return ret;

            offset_siz = size_out + opcode_size;
            if (bytes_len < offset_siz)
                return WALLY_EINVAL;

            if (opcode_size == 1 && size_out == EC_PUBLIC_KEY_LEN && !op_else_found) {
                unsigned char tweak[HMAC_SHA256_LEN];
                secp256k1_pubkey pub_key;
                secp256k1_pubkey pub_key_from_tweak;
                secp256k1_pubkey pub_key_tweaked;
                const secp256k1_pubkey *pub_key_combination[2];
                secp256k1_pubkey pub_key_combined;
                size_t push_size;

                if (!pubkey_parse(&pub_key, p + 1, EC_PUBLIC_KEY_LEN))
                    return WALLY_ERROR;
                memcpy(&pub_key_tweaked, &pub_key, sizeof(pub_key));
                if ((ret = wally_hmac_sha256(p + 1, EC_PUBLIC_KEY_LEN, script, script_len, tweak, HMAC_SHA256_LEN)) != WALLY_OK)
                    return ret;
                if (!pubkey_tweak_add(ctx, &pub_key_tweaked, tweak))
                    return WALLY_ERROR;
                if (!pubkey_serialize(ser_pub_key, &ser_len, &pub_key_tweaked, PUBKEY_COMPRESSED))
                    return WALLY_ERROR;
                if ((ret = wally_script_push_from_bytes(ser_pub_key, ser_len, 0, q, bytes_len, &push_size)) != WALLY_OK)
                    return ret;
                /* sanity checks as per elementsd */
                if (!pubkey_create(ctx, &pub_key_from_tweak, tweak))
                    return WALLY_ERROR;
                if (!pubkey_negate(&pub_key))
                    return WALLY_ERROR;

                pub_key_combination[0] = &pub_key;
                pub_key_combination[1] = &pub_key_tweaked;
                if (!pubkey_combine(&pub_key_combined, pub_key_combination, 2))
                    return WALLY_ERROR;
                if (memcmp(&pub_key_combined, &pub_key_from_tweak, sizeof(secp256k1_pubkey)) != 0)
                    return WALLY_ERROR;
            }
            else
                memcpy(q, p, offset_siz);
            p += offset_siz;
            q += offset_siz;
            bytes_len -= offset_siz;
        } else {
            if (*p == OP_ELSE && flags == 0) {
                op_else_found = true;
            }

            *q++ = *p++;
            --bytes_len;
        }
        if (bytes_len == 0)
            break;
    }

    if (written)
        *written = redeem_script_len;

    return WALLY_OK;
}